

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PureArrayFactory *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Array *a6;
  Array *a5;
  Array *a4;
  Array *a3;
  Array *a2;
  Array *a1;
  PureArrayFactory *factory;
  char **argv_local;
  int argc_local;
  
  this = (PureArrayFactory *)operator_new(0x20);
  PureArrayFactory::PureArrayFactory(this,10,7,3);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,1);
  iVar2 = (*this->_vptr_PureArrayFactory[2])(this,2);
  iVar3 = (*this->_vptr_PureArrayFactory[2])(this,3);
  iVar4 = (*this->_vptr_PureArrayFactory[2])(this,1);
  iVar5 = (*this->_vptr_PureArrayFactory[2])(this,2);
  iVar6 = (*this->_vptr_PureArrayFactory[2])(this,3);
  if ((long *)CONCAT44(extraout_var,iVar1) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))();
  }
  if ((long *)CONCAT44(extraout_var_00,iVar2) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))();
  }
  if ((long *)CONCAT44(extraout_var_01,iVar3) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x20))();
  }
  if ((long *)CONCAT44(extraout_var_02,iVar4) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x20))();
  }
  if ((long *)CONCAT44(extraout_var_03,iVar5) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x20))();
  }
  if ((long *)CONCAT44(extraout_var_04,iVar6) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x20))();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	PureArrayFactory *factory = new PureArrayFactory(10, 7, 3);

	Array *a1 = factory->getPureArray(1);
	Array *a2 = factory->getPureArray(2);
	Array *a3 = factory->getPureArray(3);
	Array *a4 = factory->getPureArray(1);
	Array *a5 = factory->getPureArray(2);
	Array *a6 = factory->getPureArray(3);

	if (a1)
		a1->printArray();

	if (a2)
		a2->printArray();

	if (a3)
		a3->printArray();

	if (a4)
		a4->printArray();

	if (a5)
		a5->printArray();

	if (a6)
		a6->printArray();

	return 0;
}